

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::SourceCodeInfo::MergePartialFromCodedStream
          (SourceCodeInfo *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  SourceCodeInfo_Location *value;
  UnknownFieldSet *unknown_fields;
  uint32 tag;
  CodedInputStream *input_local;
  SourceCodeInfo *this_local;
  uint32 local_20;
  
  do {
    while( true ) {
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
        input->last_tag_ = (uint)*input->buffer_;
        io::CodedInputStream::Advance(input,1);
        local_20 = input->last_tag_;
      }
      else {
        uVar2 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar2;
        local_20 = input->last_tag_;
      }
      if (local_20 == 0) {
        return true;
      }
      iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_20);
      if ((iVar3 != 1) ||
         (WVar4 = internal::WireFormatLite::GetTagWireType(local_20),
         WVar4 != WIRETYPE_LENGTH_DELIMITED)) break;
      do {
        value = add_location(this);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::SourceCodeInfo_Location>(input,value);
        if (!bVar1) {
          return false;
        }
        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\n')) {
          io::CodedInputStream::Advance(input,1);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      } while (bVar1);
      bVar1 = io::CodedInputStream::ExpectAtEnd(input);
      if (bVar1) {
        return true;
      }
    }
    WVar4 = internal::WireFormatLite::GetTagWireType(local_20);
    if (WVar4 == WIRETYPE_END_GROUP) {
      return true;
    }
    unknown_fields = mutable_unknown_fields(this);
    bVar1 = internal::WireFormat::SkipField(input,local_20,unknown_fields);
  } while (bVar1);
  return false;
}

Assistant:

bool SourceCodeInfo::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_location:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_location()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(10)) goto parse_location;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}